

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O2

bool leveldb::SomeFileOverlapsRange
               (InternalKeyComparator *icmp,bool disjoint_sorted_files,
               vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *files,
               Slice *smallest_user_key,Slice *largest_user_key)

{
  long lVar1;
  Comparator *ucmp;
  FileMetaData *f;
  pointer ppFVar2;
  bool bVar3;
  bool bVar4;
  uint uVar5;
  int iVar6;
  size_t i;
  ulong uVar7;
  undefined7 in_register_00000031;
  long in_FS_OFFSET;
  Slice local_68;
  InternalKey small_key;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  ucmp = icmp->user_comparator_;
  if ((int)CONCAT71(in_register_00000031,disjoint_sorted_files) == 0) {
    uVar7 = 0;
    while( true ) {
      ppFVar2 = (files->
                super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                )._M_impl.super__Vector_impl_data._M_start;
      bVar4 = uVar7 < (ulong)((long)(files->
                                    super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                                    )._M_impl.super__Vector_impl_data._M_finish - (long)ppFVar2 >> 3
                             );
      if (!bVar4) break;
      f = ppFVar2[uVar7];
      if (smallest_user_key == (Slice *)0x0) {
LAB_0054c779:
        bVar3 = BeforeFile(ucmp,largest_user_key,f);
        if (!bVar3) break;
      }
      else {
        small_key.rep_._0_16_ = InternalKey::user_key(&f->largest);
        iVar6 = (*ucmp->_vptr_Comparator[2])(ucmp,smallest_user_key,&small_key);
        if (iVar6 < 1) goto LAB_0054c779;
      }
      uVar7 = uVar7 + 1;
    }
  }
  else {
    if (smallest_user_key == (Slice *)0x0) {
      uVar7 = 0;
    }
    else {
      InternalKey::InternalKey(&small_key,smallest_user_key,0xffffffffffffff,kTypeValue);
      local_68 = InternalKey::Encode(&small_key);
      uVar5 = FindFile(icmp,files,&local_68);
      uVar7 = (ulong)uVar5;
      std::__cxx11::string::~string((string *)&small_key);
    }
    ppFVar2 = (files->
              super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>)
              ._M_impl.super__Vector_impl_data._M_start;
    if (uVar7 < (ulong)((long)(files->
                              super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                              )._M_impl.super__Vector_impl_data._M_finish - (long)ppFVar2 >> 3)) {
      bVar4 = BeforeFile(ucmp,largest_user_key,ppFVar2[uVar7]);
      bVar4 = !bVar4;
    }
    else {
      bVar4 = false;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar4;
  }
  __stack_chk_fail();
}

Assistant:

bool SomeFileOverlapsRange(const InternalKeyComparator& icmp,
                           bool disjoint_sorted_files,
                           const std::vector<FileMetaData*>& files,
                           const Slice* smallest_user_key,
                           const Slice* largest_user_key) {
  const Comparator* ucmp = icmp.user_comparator();
  if (!disjoint_sorted_files) {
    // Need to check against all files
    for (size_t i = 0; i < files.size(); i++) {
      const FileMetaData* f = files[i];
      if (AfterFile(ucmp, smallest_user_key, f) ||
          BeforeFile(ucmp, largest_user_key, f)) {
        // No overlap
      } else {
        return true;  // Overlap
      }
    }
    return false;
  }

  // Binary search over file list
  uint32_t index = 0;
  if (smallest_user_key != nullptr) {
    // Find the earliest possible internal key for smallest_user_key
    InternalKey small_key(*smallest_user_key, kMaxSequenceNumber,
                          kValueTypeForSeek);
    index = FindFile(icmp, files, small_key.Encode());
  }

  if (index >= files.size()) {
    // beginning of range is after all files, so no overlap.
    return false;
  }

  return !BeforeFile(ucmp, largest_user_key, files[index]);
}